

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O1

int CVodeGetNumJTSetupEvals(void *cvode_mem,long *njtsetups)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeGetNumJTSetupEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *njtsetups = local_18->njtsetup;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumJTSetupEvals(void *cvode_mem, long int *njtsetups)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  int      retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, "CVodeGetNumJTSetupEvals",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);
  *njtsetups = cvls_mem->njtsetup;
  return(CVLS_SUCCESS);
}